

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::UnCamelCaseEnumShortName
          (string *__return_storage_ptr__,objectivec *this,string *name)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(long *)(this + 8) != 0) {
    uVar1 = 0;
    do {
      if ((byte)(*(char *)(*(long *)this + uVar1) + 0xbfU) < 0x1a && uVar1 != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar1 = uVar1 + 1;
    } while (uVar1 < *(ulong *)(this + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

string UnCamelCaseEnumShortName(const string& name) {
  string result;
  for (int i = 0; i < name.size(); i++) {
    char c = name[i];
    if (i > 0 && ascii_isupper(c)) {
      result += '_';
    }
    result += ascii_toupper(c);
  }
  return result;
}